

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O0

void ge25519_scalarmult_base_niels
               (ge25519 *r,uint8_t (*basepoint_table) [96],bignum256modm_element_t *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint64_t *puVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 local_1f8 [8];
  ge25519_niels t;
  char local_178 [4];
  uint32_t i;
  char b [64];
  bignum256modm_element_t *s_local;
  uint8_t (*basepoint_table_local) [96];
  ge25519 *r_local;
  uint64_t c_2;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t r4;
  uint64_t r3;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint128_t t_1 [5];
  uint64_t c;
  uint64_t c_1;
  
  b._56_8_ = s;
  contract256_window4_modm(local_178,s);
  ge25519_scalarmult_base_choose_niels((ge25519_niels *)local_1f8,basepoint_table,0,local_178[1]);
  r->x[0] = (t.ysubx[4] + 0x1fffffffffffb4) - (long)local_1f8;
  uVar32 = r->x[0];
  r->x[0] = r->x[0] & 0x7ffffffffffff;
  r->x[1] = ((t.xaddy[0] + 0x1ffffffffffffc) - t.ysubx[0]) + (uVar32 >> 0x33);
  uVar32 = r->x[1];
  r->x[1] = r->x[1] & 0x7ffffffffffff;
  r->x[2] = ((t.xaddy[1] + 0x1ffffffffffffc) - t.ysubx[1]) + (uVar32 >> 0x33);
  uVar32 = r->x[2];
  r->x[2] = r->x[2] & 0x7ffffffffffff;
  r->x[3] = ((t.xaddy[2] + 0x1ffffffffffffc) - t.ysubx[2]) + (uVar32 >> 0x33);
  uVar32 = r->x[3];
  r->x[3] = r->x[3] & 0x7ffffffffffff;
  r->x[4] = ((t.xaddy[3] + 0x1ffffffffffffc) - t.ysubx[3]) + (uVar32 >> 0x33);
  uVar32 = r->x[4];
  r->x[4] = r->x[4] & 0x7ffffffffffff;
  r->x[0] = (uVar32 >> 0x33) * 0x13 + r->x[0];
  puVar30 = r->y;
  *puVar30 = t.ysubx[4] + (long)local_1f8;
  uVar32 = *puVar30;
  *puVar30 = *puVar30 & 0x7ffffffffffff;
  r->y[1] = t.xaddy[0] + t.ysubx[0] + (uVar32 >> 0x33);
  uVar32 = r->y[1];
  r->y[1] = r->y[1] & 0x7ffffffffffff;
  r->y[2] = t.xaddy[1] + t.ysubx[1] + (uVar32 >> 0x33);
  uVar32 = r->y[2];
  r->y[2] = r->y[2] & 0x7ffffffffffff;
  r->y[3] = t.xaddy[2] + t.ysubx[2] + (uVar32 >> 0x33);
  uVar32 = r->y[3];
  r->y[3] = r->y[3] & 0x7ffffffffffff;
  r->y[4] = t.xaddy[3] + t.ysubx[3] + (uVar32 >> 0x33);
  uVar32 = r->y[4];
  r->y[4] = r->y[4] & 0x7ffffffffffff;
  *puVar30 = (uVar32 >> 0x33) * 0x13 + *puVar30;
  memset(r->z,0,0x28);
  r->t[0] = t.xaddy[4];
  r->t[1] = t.t2d[0];
  r->t[2] = t.t2d[1];
  r->t[3] = t.t2d[2];
  r->t[4] = t.t2d[3];
  r->z[0] = 2;
  for (t.t2d[4]._4_4_ = 3; t.t2d[4]._4_4_ < 0x40; t.t2d[4]._4_4_ = t.t2d[4]._4_4_ + 2) {
    ge25519_scalarmult_base_choose_niels
              ((ge25519_niels *)local_1f8,basepoint_table,t.t2d[4]._4_4_ >> 1,
               local_178[t.t2d[4]._4_4_]);
    ge25519_nielsadd2(r,(ge25519_niels *)local_1f8);
  }
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double(r,r);
  ge25519_scalarmult_base_choose_niels((ge25519_niels *)local_1f8,basepoint_table,0,local_178[0]);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = t.xaddy[4];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = t.t2d[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = t.xaddy[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t.t2d[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = t.xaddy[4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = t.t2d[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = t.t2d[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = t.xaddy[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = t.t2d[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = t.t2d[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = t.t2d[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = t.xaddy[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = t.t2d[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = t.t2d[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = t.t2d[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = t.t2d[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = t.t2d[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = t.t2d[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = t.t2d[1];
  auVar1 = ZEXT816(0x8949b964e481e1) * auVar19 +
           ZEXT816(0x70310d2021430b) * auVar18 +
           ZEXT816(0x1f7afc62973807) * auVar17 + ZEXT816(0x6164115ad394ed) * auVar16 +
           ZEXT816(0x34dca135978a3) * auVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = t.t2d[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = t.t2d[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = t.t2d[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = t.t2d[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = t.t2d[3];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = t.t2d[3];
  r0 = auVar1._0_8_;
  t_1[0]._0_8_ = auVar1._8_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (long)t_1[0] << 0xd | r0 >> 0x33;
  auVar26 = ZEXT816(0x8949b964e481e1) * auVar22 +
            ZEXT816(0x70310d2021430b) * auVar21 + ZEXT816(0x6164115ad394ed) * auVar20 +
            ZEXT816(0x1a8283b156ebd) * auVar3 + ZEXT816(0x34dca135978a3) * auVar2 + auVar26;
  uVar31 = auVar26._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar26._8_8_ << 0xd | uVar31 >> 0x33;
  auVar27 = ZEXT816(0x8949b964e481e1) * auVar24 + ZEXT816(0x6164115ad394ed) * auVar23 +
            ZEXT816(0x1a8283b156ebd) * auVar6 +
            ZEXT816(0x5e7a26001c029) * auVar5 + ZEXT816(0x34dca135978a3) * auVar4 + auVar27;
  uVar32 = auVar27._0_8_;
  t.t2d[1] = uVar32 & 0x7ffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar27._8_8_ << 0xd | uVar32 >> 0x33;
  auVar28 = ZEXT816(0x6164115ad394ed) * auVar25 +
            ZEXT816(0x5e7a26001c029) * auVar10 +
            ZEXT816(0x1a8283b156ebd) * auVar9 +
            ZEXT816(0x739c663a03cbb) * auVar8 + ZEXT816(0x34dca135978a3) * auVar7 + auVar28;
  uVar32 = auVar28._0_8_;
  t.t2d[2] = uVar32 & 0x7ffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar28._8_8_ << 0xd | uVar32 >> 0x33;
  auVar29 = ZEXT816(0x5e7a26001c029) * auVar15 +
            ZEXT816(0x1a8283b156ebd) * auVar14 +
            ZEXT816(0x739c663a03cbb) * auVar13 +
            ZEXT816(0x52036cee2b6ff) * auVar12 + ZEXT816(0x34dca135978a3) * auVar11 + auVar29;
  uVar32 = auVar29._0_8_;
  t.t2d[3] = uVar32 & 0x7ffffffffffff;
  uVar32 = (auVar29._8_8_ << 0xd | uVar32 >> 0x33) * 0x13 + (r0 & 0x7ffffffffffff);
  t.xaddy[4] = uVar32 & 0x7ffffffffffff;
  t.t2d[0] = (uVar32 >> 0x33) + (uVar31 & 0x7ffffffffffff);
  ge25519_nielsadd2(r,(ge25519_niels *)local_1f8);
  for (t.t2d[4]._4_4_ = 2; t.t2d[4]._4_4_ < 0x40; t.t2d[4]._4_4_ = t.t2d[4]._4_4_ + 2) {
    ge25519_scalarmult_base_choose_niels
              ((ge25519_niels *)local_1f8,basepoint_table,t.t2d[4]._4_4_ >> 1,
               local_178[t.t2d[4]._4_4_]);
    ge25519_nielsadd2(r,(ge25519_niels *)local_1f8);
  }
  return;
}

Assistant:

static void
ge25519_scalarmult_base_niels(ge25519 *r, const uint8_t basepoint_table[256][96], const bignum256modm s) {
	signed char b[64];
	uint32_t i;
	ge25519_niels t;

	contract256_window4_modm(b, s);

	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[1]);
	curve25519_sub_reduce(r->x, t.xaddy, t.ysubx);
	curve25519_add_reduce(r->y, t.xaddy, t.ysubx);
	memset(r->z, 0, sizeof(bignum25519));
	curve25519_copy(r->t, t.t2d);
	r->z[0] = 2;	
	for (i = 3; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double(r, r);
	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[0]);
	curve25519_mul(t.t2d, t.t2d, ge25519_ecd);
	ge25519_nielsadd2(r, &t);
	for(i = 2; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
}